

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O2

void __thiscall
t_netstd_generator::generate_service_interface
          (t_netstd_generator *this,ostream *out,t_service *tservice)

{
  int *piVar1;
  t_struct *ptVar2;
  t_function *ptVar3;
  t_service *scope;
  bool bVar4;
  ostream *poVar5;
  pointer pptVar6;
  iterator iVar7;
  pointer pptVar8;
  t_netstd_generator *this_00;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  t_service *local_f0;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_iface;
  string extends;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)&extends,"",(allocator *)&extends_iface);
  std::__cxx11::string::string((string *)&extends_iface,"",(allocator *)&local_130);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_130,this,&tservice->extends_->super_t_type,true);
    std::__cxx11::string::operator=((string *)&extends,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::operator+(&local_110," : ",&extends);
    std::operator+(&local_130,&local_110,".IAsync");
    std::__cxx11::string::operator=((string *)&extends_iface,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_110);
  }
  generate_netstd_doc(this,out,(t_doc *)tservice);
  if (this->wcf_ == true) {
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_130);
    poVar5 = std::operator<<(poVar5,"[ServiceContract(Namespace=\"");
    poVar5 = std::operator<<(poVar5,(string *)&this->wcf_namespace_);
    poVar5 = std::operator<<(poVar5,"\")]");
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_130);
  }
  prepare_member_name_mapping(this,tservice);
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_130);
  poVar5 = std::operator<<(poVar5,"public interface IAsync");
  poVar5 = std::operator<<(poVar5,(string *)&extends_iface);
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_110,(t_generator *)this);
  poVar5 = std::operator<<(poVar5,(string *)&local_110);
  poVar5 = std::operator<<(poVar5,"{");
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  local_f0 = tservice;
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector(&functions,&tservice->functions_)
  ;
  for (pptVar6 = functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pptVar6 !=
      functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
      super__Vector_impl_data._M_finish; pptVar6 = pptVar6 + 1) {
    generate_netstd_doc(this,out,*pptVar6);
    if (this->wcf_ == true) {
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_130);
      poVar5 = std::operator<<(poVar5,"[OperationContract]");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
      std::__cxx11::string::~string((string *)&local_130);
      ptVar2 = (*pptVar6)->xceptions_;
      for (pptVar8 = (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
                     _M_impl.super__Vector_impl_data._M_start;
          pptVar8 !=
          (ptVar2->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar8 = pptVar8 + 1) {
        t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
        poVar5 = std::operator<<(out,(string *)&local_130);
        type_name_abi_cxx11_(&local_90,this,(*pptVar8)->type_,true);
        std::operator+(&local_50,"[FaultContract(typeof(",&local_90);
        std::operator+(&local_110,&local_50,"Fault))]");
        poVar5 = std::operator<<(poVar5,(string *)&local_110);
        std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_110);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        std::__cxx11::string::~string((string *)&local_130);
      }
    }
    ptVar3 = *pptVar6;
    std::__cxx11::string::string((string *)&local_130,"deprecated",(allocator *)&local_110);
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(ptVar3->annotations_)._M_t,&local_130);
    std::__cxx11::string::~string((string *)&local_130);
    if (&((*pptVar6)->annotations_)._M_t._M_impl.super__Rb_tree_header !=
        (_Rb_tree_header *)iVar7._M_node) {
      t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
      poVar5 = std::operator<<(out,(string *)&local_130);
      std::operator<<(poVar5,"[Obsolete");
      std::__cxx11::string::~string((string *)&local_130);
      if (iVar7._M_node[2]._M_parent != (_Base_ptr)0x0) {
        bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(iVar7._M_node + 2),"1");
        if (bVar4) {
          this_00 = (t_netstd_generator *)0x2f5ea1;
          poVar5 = std::operator<<(out,"(");
          make_csharp_string_literal(&local_130,this_00,(string *)(iVar7._M_node + 2));
          poVar5 = std::operator<<(poVar5,(string *)&local_130);
          std::operator<<(poVar5,")");
          std::__cxx11::string::~string((string *)&local_130);
        }
      }
      poVar5 = std::operator<<(out,"]");
      std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    }
    t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
    poVar5 = std::operator<<(out,(string *)&local_130);
    ptVar3 = *pptVar6;
    std::__cxx11::string::string((string *)&local_70,"",(allocator *)&local_50);
    function_signature_async(&local_110,this,ptVar3,&local_70,0);
    poVar5 = std::operator<<(poVar5,(string *)&local_110);
    poVar5 = std::operator<<(poVar5,";");
    poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_130);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_130,(t_generator *)this);
  poVar5 = std::operator<<(out,(string *)&local_130);
  scope = local_f0;
  poVar5 = std::operator<<(poVar5,"}");
  poVar5 = std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar5,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_130);
  cleanup_member_name_mapping(this,scope);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base
            (&functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>);
  std::__cxx11::string::~string((string *)&extends_iface);
  std::__cxx11::string::~string((string *)&extends);
  return;
}

Assistant:

void t_netstd_generator::generate_service_interface(ostream& out, t_service* tservice)
{
    string extends = "";
    string extends_iface = "";
    if (tservice->get_extends() != nullptr)
    {
        extends = type_name(tservice->get_extends());
        extends_iface = " : " + extends + ".IAsync";
    }

    //out << endl << endl;

    generate_netstd_doc(out, tservice);

    if (is_wcf_enabled())
    {
        out << indent() << "[ServiceContract(Namespace=\"" << wcf_namespace_ << "\")]" << endl;
    }

    prepare_member_name_mapping(tservice);
    out << indent() << "public interface IAsync" << extends_iface << endl
        << indent() << "{" << endl;

    indent_up();
    vector<t_function*> functions = tservice->get_functions();
    vector<t_function*>::iterator f_iter;
    for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter)
    {
        generate_netstd_doc(out, *f_iter);

        // if we're using WCF, add the corresponding attributes
        if (is_wcf_enabled())
        {
            out << indent() << "[OperationContract]" << endl;

            const vector<t_field*>& xceptions = (*f_iter)->get_xceptions()->get_members();
            vector<t_field*>::const_iterator x_iter;
            for (x_iter = xceptions.begin(); x_iter != xceptions.end(); ++x_iter)
            {
                out << indent() << "[FaultContract(typeof(" + type_name((*x_iter)->get_type()) + "Fault))]" << endl;
            }
        }

        auto iter = (*f_iter)->annotations_.find("deprecated");
        if( (*f_iter)->annotations_.end() != iter) {
          out << indent() << "[Obsolete";
          // empty annotation values end up with "1" somewhere, ignore these as well
          if ((iter->second.length() > 0) && (iter->second != "1")) {
            out << "(" << make_csharp_string_literal(iter->second) << ")";
          }
          out << "]" << endl;
        }

        out << indent() << function_signature_async(*f_iter) << ";" << endl << endl;
    }
    indent_down();
    out << indent() << "}" << endl << endl;
    cleanup_member_name_mapping(tservice);
}